

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

void __thiscall display::add_monitor(display *this,int mon,int x,int y,int w,int h,Window root)

{
  vector<rect,_std::allocator<rect>_> *this_00;
  int iVar1;
  int y_local;
  int mon_local;
  border_t local_5d;
  int h_local;
  int w_local;
  int x_local;
  monitor_t local_50;
  
  this_00 = &this->border_rects;
  local_50.id._0_1_ = 2;
  y_local = y;
  mon_local = mon;
  h_local = h;
  w_local = w;
  x_local = x;
  std::vector<rect,std::allocator<rect>>::
  emplace_back<int&,int&,int_const&,int&,int&,border_t,unsigned_long&>
            ((vector<rect,std::allocator<rect>> *)this_00,&x_local,&y_local,&BORDER_WIDTH,&h_local,
             &mon_local,(border_t *)&local_50,&root);
  local_50.id = (uint)local_50.id._1_3_ << 8;
  std::vector<rect,std::allocator<rect>>::
  emplace_back<int&,int&,int&,int_const&,int&,border_t,unsigned_long&>
            ((vector<rect,std::allocator<rect>> *)this_00,&x_local,&y_local,&w_local,&BORDER_WIDTH,
             &mon_local,(border_t *)&local_50,&root);
  local_50.id = x_local + -1 + w_local;
  local_5d = RIGHT;
  std::vector<rect,std::allocator<rect>>::
  emplace_back<int,int&,int_const&,int&,int&,border_t,unsigned_long&>
            ((vector<rect,std::allocator<rect>> *)this_00,&local_50.id,&y_local,&BORDER_WIDTH,
             &h_local,&mon_local,&local_5d,&root);
  local_50.id = y_local + -1 + h_local;
  local_5d = BOTTOM;
  std::vector<rect,std::allocator<rect>>::
  emplace_back<int&,int,int&,int_const&,int&,border_t,unsigned_long&>
            ((vector<rect,std::allocator<rect>> *)this_00,&x_local,&local_50.id,&w_local,
             &BORDER_WIDTH,&mon_local,&local_5d,&root);
  local_50.id = mon_local;
  local_50.x = x_local;
  local_50.y = y_local;
  local_50.w = w_local;
  local_50.h = h_local;
  local_50.root = root;
  std::vector<display::monitor_t,_std::allocator<display::monitor_t>_>::
  emplace_back<display::monitor_t>(&this->monitors,&local_50);
  iVar1 = w_local + x_local;
  if (w_local + x_local <= this->width) {
    iVar1 = this->width;
  }
  this->width = iVar1;
  iVar1 = h_local + y_local;
  if (h_local + y_local <= this->height) {
    iVar1 = this->height;
  }
  this->height = iVar1;
  return;
}

Assistant:

void display::add_monitor(int mon, int x, int y, int w, int h, Window root) {
    border_rects.emplace_back(x, y, BORDER_WIDTH, h, mon, border_t::LEFT, root);
    border_rects.emplace_back(x, y, w, BORDER_WIDTH, mon, border_t::TOP, root);
    border_rects.emplace_back(x + w - BORDER_WIDTH, y, BORDER_WIDTH, h, mon, border_t::RIGHT, root);
    border_rects.emplace_back(x, y + h - BORDER_WIDTH, w, BORDER_WIDTH, mon, border_t::BOTTOM, root);

    monitors.emplace_back(monitor_t { .id = mon, .x = x, .y = y, .w = w, .h = h, .root = root });
    width = std::max(x + w, width);
    height = std::max(y + h, height);
}